

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

double pbrt::parseNumber(Token *t)

{
  string_view str;
  string_view s;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_iterator pvVar5;
  long lVar6;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long *in_FS_OFFSET;
  float fVar7;
  char *endptr;
  double val;
  int length;
  anon_class_1_0_00000001 isInteger;
  unique_ptr<char[],_std::default_delete<char[]>_> allocBuf;
  char *bufp;
  char buf [64];
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_fffffffffffffed8;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  anon_class_1_0_00000001 *paVar8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_t in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  AccumFunc in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *args;
  char *in_stack_ffffffffffffff18;
  char *fmt;
  FileLoc *in_stack_ffffffffffffff20;
  FileLoc *loc;
  char *in_stack_ffffffffffffff28;
  int local_b0 [2];
  size_t local_a8;
  char *pcStack_a0;
  double local_98;
  int local_90;
  __0 local_69 [9];
  anon_class_1_0_00000001 *local_60;
  anon_class_1_0_00000001 local_58 [72];
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  double local_8;
  
  local_10 = in_RDI;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  if (sVar3 == 1) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](local_10,0);
    if (('/' < *pvVar4) &&
       (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](local_10,0),
       *pvVar4 < ':')) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](local_10,0);
      return (double)(*pvVar4 + -0x30);
    }
    args = local_10 + 1;
    std::basic_string_view<char,_std::char_traits<char>_>::operator[](local_10,0);
    ErrorExit<char_const&>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(char *)args);
  }
  local_60 = local_58;
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            (in_stack_fffffffffffffee0);
  if ((parseNumber(pbrt::Token_const&)::reg == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parseNumber(pbrt::Token_const&)::reg), iVar2 != 0)) {
    parseNumber(pbrt::Token_const&)::$_0::operator_cast_to_function_pointer(local_69);
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (PixelAccumFunc)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    __cxa_guard_release(&parseNumber(pbrt::Token_const&)::reg);
  }
  *(long *)(*in_FS_OFFSET + -0x4d8) = *(long *)(*in_FS_OFFSET + -0x4d8) + 1;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
  if (0x3f < sVar3 + 1) {
    *(long *)(*in_FS_OFFSET + -0x4e0) = *(long *)(*in_FS_OFFSET + -0x4e0) + 1;
  }
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
  if (0x3f < sVar3 + 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
    std::make_unique<char[]>(in_stack_fffffffffffffef8);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(in_stack_fffffffffffffee0);
    local_60 = (anon_class_1_0_00000001 *)
               std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_fffffffffffffee0)
    ;
  }
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::end(local_10);
  std::copy<char_const*,char*>
            ((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
  paVar8 = local_60;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
  paVar8[sVar3] = (anon_class_1_0_00000001)0x0;
  local_90 = 0;
  local_a8 = local_10->_M_len;
  pcStack_a0 = local_10->_M_str;
  str._M_len._7_1_ = in_stack_ffffffffffffff07;
  str._M_len._0_7_ = in_stack_ffffffffffffff00;
  str._M_str = pvVar5;
  bVar1 = parseNumber::anon_class_1_0_00000001::operator()(paVar8,str);
  if (bVar1) {
    lVar6 = strtol((char *)local_60,(char **)local_b0,10);
    local_98 = (double)lVar6;
    local_90 = local_b0[0] - (int)local_60;
  }
  else {
    paVar8 = local_60;
    std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
    fVar7 = double_conversion::StringToDoubleConverter::StringToFloat
                      ((StringToDoubleConverter *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),(char *)paVar8,
                       (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                       (int *)in_stack_fffffffffffffed8);
    local_98 = (double)fVar7;
  }
  if (local_90 != 0) {
    local_8 = local_98;
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(in_stack_fffffffffffffee0);
    return local_8;
  }
  fmt = (char *)local_10->_M_len;
  loc = (FileLoc *)local_10->_M_str;
  s._M_str = in_stack_ffffffffffffff28;
  s._M_len = (size_t)loc;
  toString_abi_cxx11_(s);
  ErrorExit<std::__cxx11::string>(loc,fmt,in_stack_ffffffffffffff10);
}

Assistant:

static double parseNumber(const Token &t) {
    // Fast path for a single digit
    if (t.token.size() == 1) {
        if (!(t.token[0] >= '0' && t.token[0] <= '9'))
            ErrorExit(&t.loc, "\"%c\": expected a number", t.token[0]);
        return t.token[0] - '0';
    }

    // Copy to a buffer so we can NUL-terminate it, as strto[idf]() expect.
    char buf[64];
    char *bufp = buf;
    std::unique_ptr<char[]> allocBuf;
    CHECK_RARE(1e-5, t.token.size() + 1 >= sizeof(buf));
    if (t.token.size() + 1 >= sizeof(buf)) {
        // This should be very unusual, but is necessary in case we get a
        // goofball number with lots of leading zeros, for example.
        allocBuf = std::make_unique<char[]>(t.token.size() + 1);
        bufp = allocBuf.get();
    }

    std::copy(t.token.begin(), t.token.end(), bufp);
    bufp[t.token.size()] = '\0';

    // Can we just use strtol?
    auto isInteger = [](std::string_view str) {
        for (char ch : str)
            if (!(ch >= '0' && ch <= '9'))
                return false;
        return true;
    };

    int length = 0;
    double val;
    if (isInteger(t.token)) {
        char *endptr;
        val = double(strtol(bufp, &endptr, 10));
        length = endptr - bufp;
    } else if (sizeof(Float) == sizeof(float))
        val = floatParser.StringToFloat(bufp, t.token.size(), &length);
    else
        val = floatParser.StringToDouble(bufp, t.token.size(), &length);

    if (length == 0)
        ErrorExit(&t.loc, "%s: expected a number", toString(t.token));

    return val;
}